

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int renameParseSql(Parse *p,char *zDb,int bTable,sqlite3 *db,char *zSql,int bTemp)

{
  char cVar1;
  int iVar2;
  char local_44;
  char *local_40;
  char *zErr;
  int rc;
  int bTemp_local;
  char *zSql_local;
  sqlite3 *db_local;
  char *pcStack_18;
  int bTable_local;
  char *zDb_local;
  Parse *p_local;
  
  local_40 = (char *)0x0;
  zErr._4_4_ = bTemp;
  _rc = zSql;
  zSql_local = (char *)db;
  db_local._4_4_ = bTable;
  pcStack_18 = zDb;
  zDb_local = (char *)p;
  if (bTemp == 0) {
    iVar2 = sqlite3FindDbName(db,zDb);
    local_44 = (char)iVar2;
  }
  else {
    local_44 = '\x01';
  }
  zSql_local[0xb4] = local_44;
  memset(zDb_local,0,0x1a0);
  cVar1 = '\x02';
  if (db_local._4_4_ != 0) {
    cVar1 = '\x03';
  }
  zDb_local[0x114] = cVar1;
  *(char **)zDb_local = zSql_local;
  zDb_local[0xbc] = '\x01';
  zDb_local[0xbd] = '\0';
  zDb_local[0xbe] = '\0';
  zDb_local[0xbf] = '\0';
  zErr._0_4_ = sqlite3RunParser((Parse *)zDb_local,_rc,&local_40);
  *(char **)(zDb_local + 8) = local_40;
  if (zSql_local[0x61] != '\0') {
    zErr._0_4_ = 7;
  }
  if (((((int)zErr == 0) && (*(long *)(zDb_local + 0x140) == 0)) &&
      (*(long *)(zDb_local + 0x148) == 0)) && (*(long *)(zDb_local + 0x150) == 0)) {
    zErr._0_4_ = sqlite3CorruptError(0x19550);
  }
  zSql_local[0xb4] = '\0';
  return (int)zErr;
}

Assistant:

static int renameParseSql(
  Parse *p,                       /* Memory to use for Parse object */
  const char *zDb,                /* Name of schema SQL belongs to */
  int bTable,                     /* 1 -> RENAME TABLE, 0 -> RENAME COLUMN */
  sqlite3 *db,                    /* Database handle */
  const char *zSql,               /* SQL to parse */
  int bTemp                       /* True if SQL is from temp schema */
){
  int rc;
  char *zErr = 0;

  db->init.iDb = bTemp ? 1 : sqlite3FindDbName(db, zDb);

  /* Parse the SQL statement passed as the first argument. If no error
  ** occurs and the parse does not result in a new table, index or
  ** trigger object, the database must be corrupt. */
  memset(p, 0, sizeof(Parse));
  p->eParseMode = (bTable ? PARSE_MODE_RENAME_TABLE : PARSE_MODE_RENAME_COLUMN);
  p->db = db;
  p->nQueryLoop = 1;
  rc = sqlite3RunParser(p, zSql, &zErr);
  assert( p->zErrMsg==0 );
  assert( rc!=SQLITE_OK || zErr==0 );
  p->zErrMsg = zErr;
  if( db->mallocFailed ) rc = SQLITE_NOMEM;
  if( rc==SQLITE_OK 
   && p->pNewTable==0 && p->pNewIndex==0 && p->pNewTrigger==0 
  ){
    rc = SQLITE_CORRUPT_BKPT;
  }

#ifdef SQLITE_DEBUG
  /* Ensure that all mappings in the Parse.pRename list really do map to
  ** a part of the input string.  */
  if( rc==SQLITE_OK ){
    int nSql = sqlite3Strlen30(zSql);
    RenameToken *pToken;
    for(pToken=p->pRename; pToken; pToken=pToken->pNext){
      assert( pToken->t.z>=zSql && &pToken->t.z[pToken->t.n]<=&zSql[nSql] );
    }
  }
#endif

  db->init.iDb = 0;
  return rc;
}